

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.cpp
# Opt level: O0

bool __thiscall Clasp::Asp::Preprocessor::classifyProgram(Preprocessor *this,VarVec *supported)

{
  bool bVar1;
  uint32 uVar2;
  size_type sVar3;
  const_reference puVar4;
  reference pBVar5;
  LogicProgram *in_RSI;
  uint *in_RDI;
  size_type i;
  size_type index;
  PrgBody *body;
  Preprocessor *in_stack_00000028;
  Var bodyId;
  Id_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint n;
  undefined4 uVar6;
  Preprocessor *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe4;
  undefined1 backprop;
  uint n_00;
  bool local_1;
  
  backprop = (undefined1)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  uVar6 = 0;
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2));
  bVar1 = LogicProgram::propagate(in_RSI,(bool)backprop);
  if (bVar1) {
    n = 0;
    do {
      while (uVar2 = nextBodyId(in_stack_ffffffffffffffd8,(size_type *)CONCAT44(uVar6,n)),
            uVar2 != 0x40000000) {
        in_stack_ffffffffffffffd8 = (Preprocessor *)addBodyVar(in_stack_00000028,body._4_4_);
        bVar1 = LogicProgram::hasConflict
                          ((LogicProgram *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        if (bVar1) {
          return false;
        }
        bVar1 = addHeadsToUpper((Preprocessor *)supported,(PrgBody *)in_stack_00000028);
        if (!bVar1) {
          return false;
        }
      }
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2));
      uVar6 = 0;
      in_stack_ffffffffffffffc4 = n;
      while (n = in_stack_ffffffffffffffc4,
            sVar3 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI),
            in_stack_ffffffffffffffc4 < sVar3) {
        puVar4 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI,n);
        n_00 = *puVar4;
        in_stack_ffffffffffffffd8 =
             (Preprocessor *)
             LogicProgram::getBody
                       ((LogicProgram *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
        pBVar5 = bk_lib::
                 pod_vector<Clasp::Asp::Preprocessor::BodyExtra,_std::allocator<Clasp::Asp::Preprocessor::BodyExtra>_>
                 ::operator[]((pod_vector<Clasp::Asp::Preprocessor::BodyExtra,_std::allocator<Clasp::Asp::Preprocessor::BodyExtra>_>
                               *)(in_RDI + 6),n_00);
        if ((-1 < (int)*pBVar5) &&
           (bVar1 = PrgNode::relevant((PrgNode *)in_stack_ffffffffffffffd8), bVar1)) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar6,n),
                     in_RDI);
          break;
        }
        bVar1 = PrgNode::relevant((PrgNode *)in_stack_ffffffffffffffd8);
        if ((!bVar1) && (bVar1 = PrgNode::hasVar((PrgNode *)in_stack_ffffffffffffffd8), bVar1)) {
          PrgNode::clearLiteral((PrgNode *)in_stack_ffffffffffffffd8,false);
        }
        in_stack_ffffffffffffffc4 = n + 1;
      }
      bVar1 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2));
    } while (!bVar1);
    bVar1 = LogicProgram::hasConflict
                      ((LogicProgram *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                      );
    local_1 = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Preprocessor::classifyProgram(const VarVec& supported) {
	Var bodyId; PrgBody* body;
	VarVec::size_type index = 0;
	follow_.clear();
	if (!prg_->propagate(true)) { return false; }
	for (VarVec::size_type i = 0;;) {
		while ( (bodyId = nextBodyId(index)) != varMax ) {
			body = addBodyVar(bodyId);
			if (prg_->hasConflict())    { return false; }
			if (!addHeadsToUpper(body)) { return false; }
		}
		follow_.clear();
		index = 0;
		// select next unclassified supported body
		for (; i < supported.size(); ++i) {
			bodyId  = supported[i];
			body    = prg_->getBody(bodyId);
			if (bodyInfo_[bodyId].bSeen == 0 && body->relevant()) {
				follow_.push_back(bodyId);
				break;
			}
			else if (!body->relevant() && body->hasVar()) {
				body->clearLiteral(false);
			}
		}
		if (follow_.empty()) break;
	}
	return !prg_->hasConflict();
}